

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_uri(ASN1_IA5STRING *uri,ASN1_IA5STRING *base)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_68 [8];
  CBS host;
  undefined1 local_50 [7];
  uint8_t byte;
  CBS scheme;
  CBS base_cbs;
  CBS uri_cbs;
  ASN1_IA5STRING *base_local;
  ASN1_IA5STRING *uri_local;
  
  CBS_init((CBS *)&base_cbs.len,uri->data,(long)uri->length);
  CBS_init((CBS *)&scheme.len,base->data,(long)base->length);
  iVar1 = CBS_get_until_first((CBS *)&base_cbs.len,(CBS *)local_50,':');
  if (((((iVar1 == 0) || (iVar1 = CBS_skip((CBS *)&base_cbs.len,1), iVar1 == 0)) ||
       (iVar1 = CBS_get_u8((CBS *)&base_cbs.len,(uint8_t *)((long)&host.len + 7)), iVar1 == 0)) ||
      ((host.len._7_1_ != '/' ||
       (iVar1 = CBS_get_u8((CBS *)&base_cbs.len,(uint8_t *)((long)&host.len + 7)), iVar1 == 0)))) ||
     (host.len._7_1_ != '/')) {
    return 0x35;
  }
  iVar1 = CBS_get_until_first((CBS *)&base_cbs.len,(CBS *)local_68,':');
  if ((iVar1 == 0) &&
     (iVar1 = CBS_get_until_first((CBS *)&base_cbs.len,(CBS *)local_68,'/'), iVar1 == 0)) {
    local_68 = (undefined1  [8])base_cbs.len;
  }
  sVar2 = CBS_len((CBS *)local_68);
  if (sVar2 == 0) {
    return 0x35;
  }
  iVar1 = starts_with((CBS *)&scheme.len,'.');
  if (iVar1 == 0) {
    iVar1 = equal_case((CBS *)&scheme.len,(CBS *)local_68);
    if (iVar1 == 0) {
      return 0x2f;
    }
    return 0;
  }
  iVar1 = has_suffix_case((CBS *)local_68,(CBS *)&scheme.len);
  if (iVar1 != 0) {
    return 0;
  }
  return 0x2f;
}

Assistant:

static int nc_uri(const ASN1_IA5STRING *uri, const ASN1_IA5STRING *base) {
  CBS uri_cbs, base_cbs;
  CBS_init(&uri_cbs, uri->data, uri->length);
  CBS_init(&base_cbs, base->data, base->length);

  // Check for foo:// and skip past it
  CBS scheme;
  uint8_t byte;
  if (!CBS_get_until_first(&uri_cbs, &scheme, ':') ||
      !CBS_skip(&uri_cbs, 1) ||  // Skip the colon
      !CBS_get_u8(&uri_cbs, &byte) || byte != '/' ||
      !CBS_get_u8(&uri_cbs, &byte) || byte != '/') {
    return X509_V_ERR_UNSUPPORTED_NAME_SYNTAX;
  }

  // Look for a port indicator as end of hostname first. Otherwise look for
  // trailing slash, or the end of the string.
  // TODO(davidben): This is not a correct URI parser and mishandles IPv6
  // literals.
  CBS host;
  if (!CBS_get_until_first(&uri_cbs, &host, ':') &&
      !CBS_get_until_first(&uri_cbs, &host, '/')) {
    host = uri_cbs;
  }

  if (CBS_len(&host) == 0) {
    return X509_V_ERR_UNSUPPORTED_NAME_SYNTAX;
  }

  // Special case: initial '.' is RHS match
  if (starts_with(&base_cbs, '.')) {
    if (has_suffix_case(&host, &base_cbs)) {
      return X509_V_OK;
    }
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  if (!equal_case(&base_cbs, &host)) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  return X509_V_OK;
}